

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wwf.cpp
# Opt level: O0

void find_moves(void)

{
  int iVar1;
  int local_18;
  int local_14;
  int i1;
  int j1;
  int j;
  int i;
  
  calc_adj();
  calc_legal_all();
  if ((start & 1U) != 0) {
    adj[1][6][6] = 1;
    (*adj)[6][6] = 1;
  }
  full_rack = rack_size == 7;
  std::vector<Move,_std::allocator<Move>_>::clear(&moves);
  for (j1 = 1; j1 <= bsize; j1 = j1 + 1) {
    for (i1 = 1; i1 <= bsize; i1 = i1 + 1) {
      if (board[j1][i1] == '\0') {
        local_14 = i1;
        iVar1 = local_14;
        do {
          local_14 = iVar1;
          iVar1 = local_14 + -1;
        } while ('\x01' < board[j1][local_14 + -1]);
        find_moves_at(j1,local_14,true,false,-1,0);
        local_18 = j1;
        iVar1 = local_18;
        do {
          local_18 = iVar1;
          iVar1 = local_18 + -1;
        } while ('\x01' < board[local_18 + -1][i1]);
        find_moves_at(local_18,i1,false,false,-1,0);
      }
    }
  }
  return;
}

Assistant:

void find_moves() {
    calc_adj();
    calc_legal_all();
    if (start) adj[0][6][6] = adj[1][6][6] = 1;
    full_rack = (rack_size == 7);
    moves.clear();
    for (int i = 1; i <= bsize; i++) {
        for (int j = 1; j <= bsize; j++) {
            if (board[i][j] == 0) { //only look on free squares to avoid redundancy
                int j1 = j;
                while (board[i][--j1] > 1); //go to leftmost taken square on board
                find_moves_at(i, j1 + 1, true);
                int i1 = i;
                while (board[--i1][j] > 1);
                find_moves_at(i1 + 1, j, false);
            }
        }
    }
}